

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O2

void __thiscall Mems::print_informations(Mems *this)

{
  ostream *poVar1;
  pointer pPVar2;
  pointer pMVar3;
  pointer pPVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"MEMS-Informations");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"_mems_mirrors.size() = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"_mems_mirrors_randomrasterized.size() = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"_mems_mirrors content: ");
  std::operator<<(poVar1,'\n');
  for (pMVar3 = (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pMVar3 != (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                _M_impl.super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"mirror id: ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pMVar3->id);
    std::operator<<(poVar1,'\n');
    std::operator<<((ostream *)&std::cout,"mirror pos: x ");
    poVar1 = std::ostream::_M_insert<double>((pMVar3->_position).x);
    std::operator<<(poVar1," ,   y ");
    poVar1 = std::ostream::_M_insert<double>((pMVar3->_position).y);
    std::operator<<(poVar1,'\n');
    std::operator<<((ostream *)&std::cout,"displayed_sample pos: x ");
    poVar1 = std::ostream::_M_insert<double>((pMVar3->_displayed_sample).x);
    std::operator<<(poVar1," ,   y ");
    poVar1 = std::ostream::_M_insert<double>((pMVar3->_displayed_sample).y);
    std::operator<<(poVar1," ,   dist: ");
    poVar1 = std::ostream::_M_insert<double>((pMVar3->_displayed_sample).dis);
    std::operator<<(poVar1,'\n');
    std::operator<<((ostream *)&std::cout,'\n');
    pPVar2 = (pMVar3->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (pPVar4 = pPVar2; pPVar4 != pPVar2; pPVar4 = pPVar4 + 1) {
      std::operator<<((ostream *)&std::cout," x ");
      poVar1 = std::ostream::_M_insert<double>(pPVar4->x);
      std::operator<<(poVar1," ,   y ");
      poVar1 = std::ostream::_M_insert<double>(pPVar4->y);
      std::operator<<(poVar1,'\n');
      pPVar2 = (pMVar3->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
  }
  return;
}

Assistant:

void Mems::print_informations(){
  std::cout << "" << '\n';
  std::cout << "MEMS-Informations" << '\n';
  std::cout << "" << '\n';
  std::cout << "_mems_mirrors.size() = "<< _mems_mirrors.size() << '\n';
  std::cout << "_mems_mirrors_randomrasterized.size() = "<< _mems_mirrors_randomrasterized.size() << '\n';
  std::cout << "" << '\n';
  std::cout << "_mems_mirrors content: " << '\n';
  for( auto it = std::begin(_mems_mirrors_multi); it!= std::end(_mems_mirrors_multi); ++it){
    std::cout <<"mirror id: " << it->id <<'\n';
    std::cout <<"mirror pos: x " << it->_position.x<<" ,   y " << it->_position.y<<'\n';
    std::cout <<"displayed_sample pos: x " << it->_displayed_sample.x<<" ,   y " << it->_displayed_sample.y<<" ,   dist: " << it->_displayed_sample.dis<<'\n';
//    std::cout <<"mirror amount of matching samples " << it->_ammount_of_matching_samples<<'\n';
    std::cout <<'\n';
    for(auto samp = std::begin(it->_matching_samples); samp != std::begin(it->_matching_samples); ++samp){
      std::cout <<" x " << samp->x<<" ,   y " << samp->y<<'\n';

    }
  }

}